

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPHandler.h
# Opt level: O2

void __thiscall HTTPHandler<Client>::handle(HTTPHandler<Client> *this,Client *client)

{
  ulong_long_type uVar1;
  error_code ec_00;
  char *pcVar2;
  bool bVar3;
  socket *psVar4;
  basic_string_view<char,_std::char_traits<char>_> x;
  string_view sVar5;
  error_code eVar6;
  bool close;
  error_code ec;
  flat_buffer buffer;
  request<http::string_body> request;
  send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_&>
  lambda;
  
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  buffer.end_ = (char *)0x0;
  buffer.out_ = (char *)0x0;
  buffer.last_ = (char *)0x0;
  buffer.begin_ = (char *)0x0;
  buffer.in_ = (char *)0x0;
  buffer.max_ = 0x7fffffffffffffff;
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message(&request);
  psVar4 = Client::get_socket(client);
  boost::beast::http::
  read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::beast::basic_flat_buffer<std::allocator<char>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
            (psVar4,&buffer,&request,&ec);
  if (ec.failed_ == true) {
    ec_00.failed_ = ec.failed_;
    ec_00._5_3_ = ec._5_3_;
    ec_00.val_ = ec.val_;
    ec_00.cat_ = ec.cat_;
    fail(ec_00,"init-read");
  }
  else {
    sVar5 = boost::beast::http::
            header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::method_string
                      (&request.
                        super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                      );
    x.len_ = (size_t)"CONNECT";
    x.ptr_ = (char *)sVar5.len_;
    bVar3 = boost::operator==((boost *)sVar5.ptr_,x,"CONNECT");
    if (bVar3) {
      HTTPSHandler<Client>::
      handle<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                (&this->https_handler,client,&request);
    }
    else {
      close = false;
      lambda.stream_ = Client::get_socket(client);
      lambda.close_ = &close;
      lambda.ec_ = &ec;
      do {
        save_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                  (this,&request);
        send_response<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,send_lambda<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>&>&>
                  (this,&request,&lambda);
        if (ec.failed_ == true) {
          pcVar2 = "init-write";
          goto LAB_00110f3a;
        }
        if (close != false) goto LAB_00110f49;
        psVar4 = Client::get_socket(client);
        boost::beast::http::
        read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::beast::basic_flat_buffer<std::allocator<char>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>>
                  (psVar4,&buffer,&request,&ec);
        eVar6 = boost::beast::http::make_error_code(end_of_stream);
        if (ec.val_ == eVar6.val_) {
          uVar1 = (eVar6.cat_)->id_;
          bVar3 = (ec.cat_)->id_ == uVar1;
          if (uVar1 == 0) {
            bVar3 = ec.cat_ == eVar6.cat_;
          }
          if (bVar3) goto LAB_00110f49;
        }
      } while (ec.failed_ == false);
      pcVar2 = "init-read";
LAB_00110f3a:
      eVar6.failed_ = ec.failed_;
      eVar6._5_3_ = ec._5_3_;
      eVar6.val_ = ec.val_;
      eVar6.cat_ = ec.cat_;
      fail(eVar6,pcVar2 + 5);
    }
  }
LAB_00110f49:
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message(&request);
  boost::beast::basic_flat_buffer<std::allocator<char>_>::~basic_flat_buffer(&buffer);
  return;
}

Assistant:

void HTTPHandler<T>::handle(T&& client) {
    beast::error_code ec;
    beast::flat_buffer buffer;
    http::request<http::string_body> request;

    http::read(client.get_socket(), buffer, request, ec);

    if (ec) {
        return fail(ec, "init-read");
    }

    // This means we've got https proxy request
    if (request.method_string() == "CONNECT") {
        https_handler.handle(std::move(client), request);
        return;
    }

    bool close = false;
    send_lambda<tcp::socket&> lambda{client.get_socket(), close, ec};
    for(;;) { 
        save_request(request);
        send_response(std::move(request), lambda);

        if (ec) {
            fail(ec, "write");
            return;
        }
        if (close) {
            return;
        }

        http::read(client.get_socket(), buffer, request, ec);

        if (ec == http::error::end_of_stream) {
            return;
        }
        if (ec) {
            fail(ec, "read");
            return;
        }
    }

}